

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

pair<bool,_dg::LLVMPointsToSet> __thiscall
dg::DGLLVMPointerAnalysis::getLLVMPointsToChecked(DGLLVMPointerAnalysis *this,Value *val)

{
  undefined1 uVar1;
  PSNode *pPVar2;
  DGLLVMPointsToSet *this_00;
  PointsToSetT *S;
  Value *in_RDX;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> extraout_RDX;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> extraout_RDX_00
  ;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> uVar3;
  pair<bool,_dg::LLVMPointsToSet> pVar4;
  
  pPVar2 = getPointsToNode((DGLLVMPointerAnalysis *)val,in_RDX);
  if ((pPVar2 == (PSNode *)0x0) || (*(long *)(pPVar2 + 200) == 0)) {
    this_00 = (DGLLVMPointsToSet *)operator_new(0x30);
    S = getUnknownPTSet();
    DGLLVMPointsToSet::DGLLVMPointsToSet(this_00,S);
    uVar1 = 0;
    uVar3._M_t.
    super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
    _M_t.
    super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
    .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
         extraout_RDX_00._M_t.
         super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
  }
  else {
    this_00 = (DGLLVMPointsToSet *)operator_new(0x30);
    DGLLVMPointsToSet::DGLLVMPointsToSet(this_00,(PointsToSetT *)(pPVar2 + 0xb0));
    uVar1 = 1;
    uVar3._M_t.
    super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
    _M_t.
    super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
    .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
         extraout_RDX._M_t.
         super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
  }
  *(undefined1 *)&(this->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis = uVar1;
  (this->super_LLVMPointerAnalysis).options.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p
       = (pointer)this_00;
  pVar4.second._impl._M_t.
  super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>.
  super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl =
       (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)
       (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)
       uVar3._M_t.
       super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
       .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
  pVar4._0_8_ = this;
  return pVar4;
}

Assistant:

std::pair<bool, LLVMPointsToSet>
    getLLVMPointsToChecked(const llvm::Value *val) override {
        DGLLVMPointsToSet *pts;
        if (auto *node = getPointsToNode(val)) {
            if (node->pointsTo.empty()) {
                pts = new DGLLVMPointsToSet(getUnknownPTSet());
                return {false, pts->toLLVMPointsToSet()};
            }
            pts = new DGLLVMPointsToSet(node->pointsTo);
            return {true, pts->toLLVMPointsToSet()};
        }
        pts = new DGLLVMPointsToSet(getUnknownPTSet());
        return {false, pts->toLLVMPointsToSet()};
    }